

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

ssa_edge_t_conflict
add_ssa_edge_1(gen_ctx_t gen_ctx,bb_insn_t_conflict def,int def_op_num,bb_insn_t_conflict use,
              int use_op_num,int dup_p)

{
  ssa_edge_t_conflict psVar1;
  MIR_op_t *pMVar2;
  ssa_edge_t_conflict ssa_edge;
  MIR_op_t *op_ref;
  int dup_p_local;
  int use_op_num_local;
  bb_insn_t_conflict use_local;
  int def_op_num_local;
  bb_insn_t_conflict def_local;
  gen_ctx_t gen_ctx_local;
  
  psVar1 = (ssa_edge_t_conflict)gen_malloc(gen_ctx,0x28);
  if (((use_op_num < 0) || (def_op_num < 0)) || (0xffff < def_op_num)) {
    __assert_fail("use_op_num >= 0 && def_op_num >= 0 && def_op_num < (1 << 16)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x943,"ssa_edge_t add_ssa_edge_1(gen_ctx_t, bb_insn_t, int, bb_insn_t, int, int)"
                 );
  }
  if (((int)*(undefined8 *)&def->insn->field_0x18 == 0xa7) && (def_op_num == 0)) {
    __assert_fail("def->insn->code != MIR_CALL || def_op_num != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x944,"ssa_edge_t add_ssa_edge_1(gen_ctx_t, bb_insn_t, int, bb_insn_t, int, int)"
                 );
  }
  psVar1->flag = '\0';
  psVar1->def = def;
  psVar1->def_op_num = (uint16_t)def_op_num;
  psVar1->use = use;
  psVar1->use_op_num = use_op_num;
  if ((dup_p == 0) && (use->insn->ops[use_op_num].data != (void *)0x0)) {
    __assert_fail("dup_p || use->insn->ops[use_op_num].data == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x94a,"ssa_edge_t add_ssa_edge_1(gen_ctx_t, bb_insn_t, int, bb_insn_t, int, int)"
                 );
  }
  use->insn->ops[use_op_num].data = psVar1;
  pMVar2 = def->insn->ops + def_op_num;
  psVar1->next_use = (ssa_edge_t)pMVar2->data;
  if (psVar1->next_use != (ssa_edge_t)0x0) {
    psVar1->next_use->prev_use = psVar1;
  }
  psVar1->prev_use = (ssa_edge_t)0x0;
  pMVar2->data = psVar1;
  return psVar1;
}

Assistant:

static ssa_edge_t add_ssa_edge_1 (gen_ctx_t gen_ctx, bb_insn_t def, int def_op_num, bb_insn_t use,
                                  int use_op_num, int dup_p MIR_UNUSED) {
  MIR_op_t *op_ref;
  ssa_edge_t ssa_edge = gen_malloc (gen_ctx, sizeof (struct ssa_edge));

  gen_assert (use_op_num >= 0 && def_op_num >= 0 && def_op_num < (1 << 16));
  gen_assert (def->insn->code != MIR_CALL || def_op_num != 0);
  ssa_edge->flag = FALSE;
  ssa_edge->def = def;
  ssa_edge->def_op_num = def_op_num;
  ssa_edge->use = use;
  ssa_edge->use_op_num = use_op_num;
  gen_assert (dup_p || use->insn->ops[use_op_num].data == NULL);
  use->insn->ops[use_op_num].data = ssa_edge;
  op_ref = &def->insn->ops[def_op_num];
  ssa_edge->next_use = op_ref->data;
  if (ssa_edge->next_use != NULL) ssa_edge->next_use->prev_use = ssa_edge;
  ssa_edge->prev_use = NULL;
  op_ref->data = ssa_edge;
  return ssa_edge;
}